

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O2

Move * __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::proposeSingleMove(Move *__return_storage_ptr__,
                   PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
                   *this,size_t vertex,size_t other)

{
  pointer puVar1;
  size_t targetPartition;
  size_t targetPartition_00;
  double dVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  Cost CVar5;
  Cost CVar6;
  
  puVar1 = (this->partitionGraph_).vertexLabels_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  targetPartition = puVar1[vertex];
  targetPartition_00 = puVar1[other];
  dVar3 = PartitionGraph::move(&this->partitionGraph_,vertex,targetPartition_00);
  if (ABS(dVar3) == INFINITY) {
    CVar5 = INFINITY;
    CVar6 = INFINITY;
    dVar3 = INFINITY;
  }
  else {
    (*(this->super_HeuristicBase)._vptr_HeuristicBase[3])(this,targetPartition,targetPartition_00);
    dVar4 = extraout_XMM0_Qa - this->localBranchingObjective_;
    PartitionGraph::move(&this->partitionGraph_,vertex,targetPartition);
    dVar2 = this->branchingObjective_;
    (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])(this);
    CVar5 = dVar2 + dVar4;
    CVar6 = extraout_XMM0_Qa_00 + dVar3 + dVar4;
    dVar3 = extraout_XMM0_Qa;
  }
  __return_storage_ptr__->vertex_ = vertex;
  __return_storage_ptr__->other_ = other;
  __return_storage_ptr__->localBranchingObj_ = dVar3;
  __return_storage_ptr__->branchingObj_ = CVar5;
  __return_storage_ptr__->obj_ = CVar6;
  return __return_storage_ptr__;
}

Assistant:

inline typename PartitionOptimizerBase<BROPT>::Move
PartitionOptimizerBase<BROPT>::proposeSingleMove(const size_t vertex,
                                                 const size_t other)
{
    const size_t previousPartition = partitionGraph_.vertexLabels_[vertex];
    const size_t targetPartition = partitionGraph_.vertexLabels_[other];

    // apply move.
    auto dObj = partitionGraph_.move(vertex, targetPartition);

    // if the move is not possible we can stop.
    // Note that partitionGraph::move does not move if its not feasible,
    // so we dont have to undo anything.
    if (std::isinf(dObj)) {
        return { vertex, other };
    }

    // Optimize branching to get best possible objective after the move.
    const auto localBranchingObj =
        solveLocalBranchingProblem(previousPartition, targetPartition);

    const auto dLocalBranchingObj =
        (localBranchingObj - localBranchingObjective_);
    dObj += dLocalBranchingObj;

    // and undo move.
    partitionGraph_.move(vertex, previousPartition);

    return { vertex, other, localBranchingObj,
             branchingObjective_ + dLocalBranchingObj, getObjective() + dObj };
}